

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

void BayesianGameIdenticalPayoff::SaveTextFormat(BayesianGameIdenticalPayoff *bg,string *filename)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  size_t sVar4;
  E *this;
  Index jtI;
  ulong uVar5;
  uint uVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string local_3d0;
  ofstream fp;
  undefined8 auStack_3a8 [3];
  byte abStack_390 [480];
  stringstream ss;
  ostream local_1a0 [376];
  
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_390[*(long *)(_fp + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)&fp,"# BayesianGameIdenticalPayoff text format.");
    std::endl<char,std::char_traits<char>>(poVar2);
    (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&fp);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar6 = 0;
    while( true ) {
      iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
      uVar5 = (ulong)uVar6;
      if (CONCAT44(extraout_var,iVar1) == uVar5) break;
      (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[4])(bg,uVar5);
      std::ostream::_M_insert<unsigned_long>((ulong)&fp);
      iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
      if (CONCAT44(extraout_var_00,iVar1) - 1U != uVar5) {
        std::operator<<((ostream *)&fp," ");
      }
      uVar6 = uVar6 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
    uVar6 = 0;
    while( true ) {
      iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
      if (CONCAT44(extraout_var_01,iVar1) == (ulong)uVar6) break;
      BayesianGameBase::GetNrTypes((BayesianGameBase *)bg,uVar6);
      std::ostream::_M_insert<unsigned_long>((ulong)&fp);
      iVar1 = (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])(bg);
      if (CONCAT44(extraout_var_02,iVar1) - 1U != (ulong)uVar6) {
        std::operator<<((ostream *)&fp," ");
      }
      uVar6 = uVar6 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
    uVar6 = 0;
    *(undefined8 *)((long)auStack_3a8 + *(long *)(_fp + -0x18)) = 0x10;
    while( true ) {
      sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
      uVar5 = (ulong)uVar6;
      if (sVar3 == uVar5) break;
      (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(bg,uVar5);
      std::ostream::_M_insert<double>(extraout_XMM0_Qa);
      sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
      if (sVar3 - 1 != uVar5) {
        std::operator<<((ostream *)&fp," ");
      }
      uVar6 = uVar6 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
    sVar3 = 0;
    while( true ) {
      sVar4 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
      if (sVar4 == sVar3) break;
      uVar6 = 0;
      while( true ) {
        sVar4 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)bg);
        uVar5 = (ulong)uVar6;
        if (sVar4 <= uVar5) break;
        (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
          super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
          _vptr_Interface_ProblemToPolicyDiscrete[0x10])(bg,sVar3,uVar5);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
        sVar4 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)bg);
        if (sVar4 - 1 != uVar5) {
          std::operator<<((ostream *)&fp," ");
        }
        uVar6 = uVar6 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&fp);
      sVar3 = (size_t)((int)sVar3 + 1);
    }
    std::ofstream::~ofstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a0,"BayesianGameIdenticalPayoff::SaveTextFormat could not open ");
  std::operator<<(poVar2,(string *)filename);
  this = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this,&local_3d0);
  __cxa_throw(this,&E::typeinfo,E::~E);
}

Assistant:

void BayesianGameIdenticalPayoff::SaveTextFormat(const BayesianGameIdenticalPayoff &bg,
                                                 const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "BayesianGameIdenticalPayoff::SaveTextFormat could not open "
           << filename;
        throw(E(ss.str()));
    }

    fp << "# BayesianGameIdenticalPayoff text format." << endl;
    fp << bg.GetNrAgents() << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrActions(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrTypes(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    fp.precision(16);
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        fp << bg.GetProbability(jtI);
        if(jtI!=(bg.GetNrJointTypes()-1))
            fp << " ";
    }
    fp << endl;
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        for(Index jaI=0; jaI < bg.GetNrJointActions(); ++jaI)
        {
            fp << bg.GetUtility(jtI,jaI);
            if(jaI!=(bg.GetNrJointActions()-1))
                fp << " ";
        }
        fp << endl;
    }
}